

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O0

void cali::init_attribute_classes(Caliper *c)

{
  Caliper *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  allocator<char> local_109;
  string local_108 [32];
  undefined8 local_e8;
  allocator<char> local_d9;
  string local_d8 [32];
  undefined8 local_b8;
  allocator<char> local_a9;
  string local_a8 [32];
  undefined8 local_88;
  allocator<char> local_79;
  string local_78 [32];
  undefined8 local_58;
  allocator<char> local_39;
  string local_38 [32];
  undefined8 local_18;
  Caliper *local_10;
  Caliper *c_local;
  
  local_10 = c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"class.aggregatable",&local_39);
  iVar2 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (c,local_38,7,0x40,0,0,0);
  class_aggregatable_attr = CONCAT44(extraout_var,iVar2);
  local_18 = class_aggregatable_attr;
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  pCVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"class.symboladdress",&local_79);
  iVar2 = (*(pCVar1->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (pCVar1,local_78,7,0x40,0,0,0);
  class_symboladdress_attr = CONCAT44(extraout_var_00,iVar2);
  local_58 = class_symboladdress_attr;
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  pCVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a8,"class.memoryaddress",&local_a9);
  iVar2 = (*(pCVar1->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (pCVar1,local_a8,7,0x40,0,0,0);
  class_memoryaddress_attr = CONCAT44(extraout_var_01,iVar2);
  local_88 = class_memoryaddress_attr;
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  pCVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"class.iteration",&local_d9);
  iVar2 = (*(pCVar1->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (pCVar1,local_d8,7,0x40,0,0,0);
  class_iteration_attr = CONCAT44(extraout_var_02,iVar2);
  local_b8 = class_iteration_attr;
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  pCVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"subscription_event",&local_109);
  iVar2 = (*(pCVar1->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                    (pCVar1,local_108,7,0x40,0,0,0);
  subscription_event_attr = CONCAT44(extraout_var_03,iVar2);
  local_e8 = subscription_event_attr;
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  cali_class_aggregatable_attr_id = Attribute::id((Attribute *)&class_aggregatable_attr);
  cali_class_symboladdress_attr_id = Attribute::id((Attribute *)&class_symboladdress_attr);
  cali_class_memoryaddress_attr_id = Attribute::id((Attribute *)&class_memoryaddress_attr);
  cali_class_iteration_attr_id = Attribute::id((Attribute *)&class_iteration_attr);
  return;
}

Assistant:

void init_attribute_classes(Caliper* c)
{
    class_aggregatable_attr  = c->create_attribute("class.aggregatable", CALI_TYPE_BOOL, CALI_ATTR_SKIP_EVENTS);
    class_symboladdress_attr = c->create_attribute("class.symboladdress", CALI_TYPE_BOOL, CALI_ATTR_SKIP_EVENTS);
    class_memoryaddress_attr = c->create_attribute("class.memoryaddress", CALI_TYPE_BOOL, CALI_ATTR_SKIP_EVENTS);
    class_iteration_attr     = c->create_attribute("class.iteration", CALI_TYPE_BOOL, CALI_ATTR_SKIP_EVENTS);
    subscription_event_attr  = c->create_attribute("subscription_event", CALI_TYPE_BOOL, CALI_ATTR_SKIP_EVENTS);

    cali_class_aggregatable_attr_id  = class_aggregatable_attr.id();
    cali_class_symboladdress_attr_id = class_symboladdress_attr.id();
    cali_class_memoryaddress_attr_id = class_memoryaddress_attr.id();
    cali_class_iteration_attr_id     = class_iteration_attr.id();
}